

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall Net::read_with_retry(Net *this,string *data)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char r [32];
  undefined1 auStack_38 [40];
  
  iVar1 = BIO_read((BIO *)this->sock,auStack_38,0x20);
  if (iVar1 == 0) {
    pcVar3 = "recv error(conn closed)";
    lVar2 = 0x17;
LAB_00107518:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    this->closed = 1;
  }
  else {
    if (iVar1 < 0) {
      iVar1 = BIO_test_flags((BIO *)this->sock,8);
      if (iVar1 == 0) {
        pcVar3 = "recv error";
        lVar2 = 10;
        goto LAB_00107518;
      }
    }
    std::__cxx11::string::append((char *)data);
  }
  return;
}

Assistant:

void Net::read_with_retry(std::string &data){
	char r[32];
	int ret;
	ret=BIO_read(sock,r,32);
	if(ret==0){
		std::cout<<"recv error(conn closed)"<<std::endl;
		closed=1;
		return;
	} else if(ret<0)
		if(!BIO_should_retry(sock)){
			std::cout<<"recv error"<<std::endl;
			closed=1;
			return;
		}
	data+=r;
}